

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O1

void pstore::exchange::export_ns::emit_compilation
               (ostream_base *os,indent ind,database *db,compilation *compilation,
               string_mapping *strings,bool comments)

{
  uint uVar1;
  value_type vVar2;
  uint128 d;
  uint uVar3;
  ostream_base *poVar4;
  char *pcVar5;
  typed_address<pstore::indirect_string> *ptVar6;
  compilation *__n;
  size_t __n_00;
  int __c;
  int __c_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar7;
  void *__buf_11;
  void *extraout_RDX_03;
  void *__buf_12;
  void *__buf_13;
  int __fd;
  undefined3 in_register_00000089;
  long lVar8;
  maybe<pstore::typed_address<pstore::indirect_string>,_void> prev_name;
  indent object_indent;
  undefined4 in_stack_ffffffffffffff98;
  bool bVar9;
  undefined7 in_stack_ffffffffffffffa1;
  indent local_4c;
  indent local_48;
  indent local_44;
  database *local_40;
  indent local_34;
  
  uVar3 = CONCAT31(in_register_00000089,comments);
  __n = compilation;
  local_4c.distance_ = ind.distance_;
  ostream_base::write(os,0x1249b8,db,(size_t)compilation);
  local_34.distance_ = local_4c.distance_ + 1;
  poVar4 = operator<<(os,&local_34);
  poVar4 = (ostream_base *)ostream_base::write(poVar4,0x1257e7,__buf,(size_t)__n);
  pcVar5 = string_mapping::index(strings,(char *)(compilation->triple_).a_.a_,__c);
  poVar4 = ostream_base::write<unsigned_long,void>(poVar4,(unsigned_long)pcVar5);
  ostream_base::write(poVar4,0x2c,__buf_00,(size_t)__n);
  __n_00 = (size_t)uVar3;
  local_40 = db;
  show_string(os,db,(typed_address<pstore::indirect_string>)(compilation->triple_).a_.a_,
              SUB41(uVar3,0));
  poVar4 = (ostream_base *)ostream_base::write(os,10,__buf_01,__n_00);
  poVar4 = operator<<(poVar4,&local_34);
  ostream_base::write(poVar4,0x1257f1,__buf_02,__n_00);
  uVar1 = compilation->size_;
  local_48.distance_ = local_34.distance_;
  ostream_base::write(os,0x124dde,__buf_03,__n_00);
  local_44.distance_ = local_48.distance_ + 1;
  bVar9 = false;
  uVar3 = uVar3 & 0xff;
  pvVar7 = extraout_RDX;
  if ((ulong)uVar1 != 0) {
    __fd = 0x124119;
    lVar8 = 0;
    do {
      ostream_base::write(os,__fd,pvVar7,__n_00);
      if (bVar9 == true) {
        ptVar6 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->
                           ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                            &stack0xffffffffffffffa0);
        __n_00 = (size_t)uVar3;
        show_string(os,local_40,(typed_address<pstore::indirect_string>)(ptVar6->a_).a_,
                    SUB41(uVar3,0));
        ostream_base::write(os,10,__buf_04,__n_00);
      }
      operator<<(os,&local_44);
      ostream_base::write(os,0x125800,__buf_05,__n_00);
      d.v_._4_4_ = uVar3;
      d.v_._0_4_ = in_stack_ffffffffffffff98;
      d.v_._8_1_ = bVar9;
      d.v_._9_7_ = in_stack_ffffffffffffffa1;
      emit_digest((export_ns *)os,*(ostream_base **)((long)(&compilation->signature_ + 4) + lVar8),d
                 );
      poVar4 = (ostream_base *)ostream_base::write(os,0x12580b,__buf_06,__n_00);
      pcVar5 = string_mapping::index
                         (strings,*(char **)((long)(&compilation->signature_ + 8) + lVar8),__c_00);
      poVar4 = ostream_base::write<unsigned_long,void>(poVar4,(unsigned_long)pcVar5);
      poVar4 = (ostream_base *)ostream_base::write(poVar4,0x125814,__buf_07,__n_00);
      poVar4 = repo::operator<<(poVar4,*(linkage *)((long)(&compilation->signature_ + 9) + lVar8) &
                                       (weak_odr|weak_any));
      ostream_base::write(poVar4,0x22,__buf_08,__n_00);
      pvVar7 = __buf_09;
      if ((*(byte *)((long)(&compilation->signature_ + 9) + lVar8) & 0x30) != 0) {
        poVar4 = (ostream_base *)ostream_base::write(os,0x125821,__buf_09,__n_00);
        poVar4 = repo::operator<<(poVar4,*(byte *)((long)(&compilation->signature_ + 9) + lVar8) >>
                                         4 & (protected_vis|hidden_vis));
        ostream_base::write(poVar4,0x22,__buf_10,__n_00);
        pvVar7 = extraout_RDX_00;
      }
      ostream_base::write(os,0x7d,pvVar7,__n_00);
      vVar2 = *(value_type *)((long)(&compilation->signature_ + 8) + lVar8);
      if (bVar9 == true) {
        ptVar6 = maybe<pstore::typed_address<pstore::indirect_string>,void>::
                 value_impl<pstore::maybe<pstore::typed_address<pstore::indirect_string>,void>&,pstore::typed_address<pstore::indirect_string>>
                           ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                            &stack0xffffffffffffffa0);
        (ptVar6->a_).a_ = vVar2;
        pvVar7 = extraout_RDX_02;
      }
      else {
        bVar9 = true;
        pvVar7 = extraout_RDX_01;
      }
      lVar8 = lVar8 + 0x30;
      __fd = 0x1249c6;
    } while ((ulong)uVar1 * 0x30 != lVar8);
  }
  if (bVar9 == true) {
    ptVar6 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->
                       ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                        &stack0xffffffffffffffa0);
    __n_00 = (size_t)uVar3;
    show_string(os,local_40,(typed_address<pstore::indirect_string>)(ptVar6->a_).a_,SUB41(uVar3,0));
    poVar4 = (ostream_base *)ostream_base::write(os,10,__buf_11,__n_00);
    operator<<(poVar4,&local_48);
    pvVar7 = extraout_RDX_03;
  }
  ostream_base::write(os,0x5d,pvVar7,__n_00);
  poVar4 = (ostream_base *)ostream_base::write(os,10,__buf_12,__n_00);
  poVar4 = operator<<(poVar4,&local_4c);
  ostream_base::write(poVar4,0x7d,__buf_13,__n_00);
  return;
}

Assistant:

void emit_compilation (ostream_base & os, indent const ind, database const & db,
                                   repo::compilation const & compilation,
                                   string_mapping const & strings, bool const comments) {
                os << "{\n";
                auto const object_indent = ind.next ();
                os << object_indent << R"("triple":)" << strings.index (compilation.triple ())
                   << ',';
                show_string (os, db, compilation.triple (), comments);
                os << '\n' << object_indent << R"("definitions":)";
                emit_array_with_name (os, object_indent, db, compilation.begin (),
                                      compilation.end (), comments,
                                      [&] (ostream_base & os1, repo::definition const & d) {
                                          os1 << R"({"digest":)";
                                          emit_digest (os1, d.digest);
                                          os1 << R"(,"name":)" << strings.index (d.name)
                                              << R"(,"linkage":")" << d.linkage () << '"';
                                          if (d.visibility () != repo::visibility::default_vis) {
                                              os1 << R"(,"visibility":")" << d.visibility () << '"';
                                          }
                                          os1 << '}';
                                          return d.name;
                                      });
                os << '\n' << ind << '}';
            }